

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_print(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  int iVar2;
  int local_44;
  int rc;
  int i;
  jx9_vm *pVm;
  char *pcStack_30;
  int nDataLen;
  char *zData;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pVm._4_4_ = 0;
  pjVar1 = pCtx->pVm;
  local_44 = 0;
  zData = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  do {
    if (apArg_local._4_4_ <= local_44) {
      return 0;
    }
    pcStack_30 = jx9_value_to_string(*(jx9_value **)(zData + (long)local_44 * 8),
                                     (int *)((long)&pVm + 4));
    if (0 < (int)pVm._4_4_) {
      iVar2 = (*(pjVar1->sVmConsumer).xConsumer)
                        (pcStack_30,pVm._4_4_,(pjVar1->sVmConsumer).pUserData);
      pjVar1->nOutputLen = pVm._4_4_ + pjVar1->nOutputLen;
      if (iVar2 == -10) {
        return -10;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static int vm_builtin_print(jx9_context *pCtx, int nArg,jx9_value **apArg)
{
	const char *zData;
	int nDataLen = 0;
	jx9_vm *pVm;
	int i, rc;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Output */
	for( i = 0 ; i < nArg ; ++i ){
		zData = jx9_value_to_string(apArg[i], &nDataLen);
		if( nDataLen > 0 ){
			rc = pVm->sVmConsumer.xConsumer((const void *)zData, (unsigned int)nDataLen, pVm->sVmConsumer.pUserData);
			/* Increment output length */
			pVm->nOutputLen += nDataLen;
			if( rc == SXERR_ABORT ){
				/* Output consumer callback request an operation abort */
				return JX9_ABORT;
			}
		}
	}
	return SXRET_OK;
}